

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_RobbingQuad_Test::~TEST_WiningStateTest_RobbingQuad_Test
          (TEST_WiningStateTest_RobbingQuad_Test *this)

{
  TEST_WiningStateTest_RobbingQuad_Test *mem;
  TEST_WiningStateTest_RobbingQuad_Test *this_local;
  
  mem = this;
  ~TEST_WiningStateTest_RobbingQuad_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(WiningStateTest, RobbingQuad)
{
	addNoWiningHand();

	WinByDiscardSituation situation;
	situation.is_robbing_quad = true;

	winByDiscard(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::RobbingQuad));
	CHECK_EQUAL(1, r.doubling_factor);
}